

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TryAllocDecommittedPages<true>
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  size_t *psVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *pDVar5;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar6;
  code *pcVar7;
  bool bVar8;
  int iVar9;
  undefined4 *puVar10;
  ulong uVar11;
  long lVar12;
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_00;
  char *pcVar13;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *pDVar14;
  ulong uVar15;
  char *local_70;
  undefined1 local_48 [8];
  EditingIterator i;
  
  i.super_Iterator.current._4_4_ = pageCount;
  iVar9 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar9 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x45c,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar8) {
LAB_0070eabb:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar10 = 0;
  }
  local_48 = (undefined1  [8])&this->decommitSegments;
  i.super_Iterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)local_48;
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  uVar11 = (ulong)i.super_Iterator.current._4_4_;
  lVar12 = uVar11 * 0x1000;
  do {
    if (i.super_Iterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar8) goto LAB_0070eabb;
      *puVar10 = 0;
    }
    i.super_Iterator.list =
         ((i.super_Iterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
    if ((undefined1  [8])i.super_Iterator.list == local_48) {
      return (char *)0x0;
    }
    this_00 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
              Data((Iterator *)local_48);
    uVar2 = this_00->freePageCount;
    uVar3 = this_00->decommitPageCount;
    pcVar13 = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocDecommitPages<BVStatic<272ul>,true>
                        (this_00,i.super_Iterator.current._4_4_,
                         (BVStatic<272UL>)*&(this_00->freePages).data,
                         (BVStatic<272UL>)*&(this_00->decommitPages).data);
    if (pcVar13 != (char *)0x0) {
      uVar4 = this_00->freePageCount;
      uVar15 = (this->freePageCount - (ulong)uVar2) + (ulong)uVar4;
      this->freePageCount = uVar15;
      this->decommitPageCount =
           (ulong)this_00->decommitPageCount + (this->decommitPageCount - (ulong)uVar3);
      if (uVar15 < this->debugMinFreePageCount) {
        this->debugMinFreePageCount = uVar15;
      }
      LogRecommitPages(this,(ulong)((i.super_Iterator.current._4_4_ - uVar2) + uVar4));
      this->usedBytes = this->usedBytes + lVar12;
      LOCK();
      totalUsedBytes = totalUsedBytes + lVar12;
      UNLOCK();
      if (maxUsedBytes < totalUsedBytes) {
        maxUsedBytes = totalUsedBytes;
      }
      if (this->memoryData != (PageMemoryData *)0x0) {
        psVar1 = &this->memoryData->allocPageCount;
        *psVar1 = *psVar1 + uVar11;
      }
      if (this_00->decommitPageCount == 0) {
        pDVar14 = GetSegmentList(this,this_00);
        pDVar5 = ((i.super_Iterator.list)->
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).prev.
                 list;
        (pDVar5->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next =
             ((i.super_Iterator.list)->
             super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next;
        (((i.super_Iterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.base)->
        prev = ((i.super_Iterator.list)->
               super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).prev;
        pDVar6 = (pDVar14->
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.
                 base;
        ((i.super_Iterator.list)->
        super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).prev =
             pDVar6->prev;
        ((i.super_Iterator.list)->
        super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.base =
             pDVar6;
        (((pDVar6->prev).base)->next).list = i.super_Iterator.list;
        (pDVar6->prev).list = i.super_Iterator.list;
        ((RealCount *)((long)local_48 + 0x10))->count =
             ((RealCount *)((long)local_48 + 0x10))->count - 1;
        (pDVar14->super_RealCount).count = (pDVar14->super_RealCount).count + 1;
        i.super_Iterator.list = pDVar5;
      }
      *pageSegment = this_00;
      local_70 = pcVar13;
    }
    if (pcVar13 != (char *)0x0) {
      return local_70;
    }
  } while( true );
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocDecommittedPages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!this->HasMultiThreadAccess());

    typename DListBase<TPageSegment>::EditingIterator i(&decommitSegments);

    while (i.Next())
    {
        TPageSegment * freeSegment = &i.Data();
        uint oldFreePageCount = freeSegment->GetFreePageCount();
        uint oldDecommitPageCount = freeSegment->GetDecommitPageCount();

        char * pages = freeSegment->template DoAllocDecommitPages<notPageAligned>(pageCount);
        if (pages != nullptr)
        {
            this->freePageCount = this->freePageCount - oldFreePageCount + freeSegment->GetFreePageCount();

#if DBG_DUMP
            this->decommitPageCount = this->decommitPageCount - oldDecommitPageCount + freeSegment->GetDecommitPageCount();
#endif
#if DBG
            UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
            uint recommitPageCount = pageCount - (oldFreePageCount - freeSegment->GetFreePageCount());
            LogRecommitPages(recommitPageCount);
            LogAllocPages(pageCount);

            if (freeSegment->GetDecommitPageCount() == 0)
            {
                auto toList = GetSegmentList(freeSegment);
                i.MoveCurrentTo(toList);
            }

            *pageSegment = freeSegment;
            return pages;
        }
    }
    return nullptr;
}